

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O3

void b_array::insert_item<Map::Pair<int,std::__cxx11::string>>
               (Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *data,size_t pos,size_t *size,
               Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *entry)

{
  ulong index;
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar1;
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar2;
  
  index = *size;
  *size = index + 1;
  while (pos < index) {
    pPVar1 = Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](data,index - 1);
    pPVar2 = Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](data,index);
    pPVar2->key = pPVar1->key;
    std::__cxx11::string::_M_assign((string *)&pPVar2->value);
    index = index - 1;
  }
  pPVar1 = Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](data,pos);
  pPVar1->key = entry->key;
  std::__cxx11::string::_M_assign((string *)&pPVar1->value);
  return;
}

Assistant:

void insert_item(b_array::Array<T>& data, size_t pos, size_t& size, const T& entry) {
    for (size_t i = size++; i > pos; i--) {
        data[i] = data[i - 1];
    }
    data[pos] = entry;
}